

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswmcpl.c
# Opt level: O0

int mcpl2ssw_parse_args(int argc,char **argv,char **inmcplfile,char **refsswfile,char **outsswfile,
                       long *nparticles_limit,long *surface_id)

{
  char *__s;
  int iVar1;
  char **ppcVar2;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  int in_EDI;
  long *in_R8;
  long *in_R9;
  long *in_stack_00000008;
  size_t j;
  int64_t *consume_digit;
  size_t n;
  char *a;
  int i;
  int64_t opt_num_isurf;
  int64_t opt_num_limit;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  char **in_stack_ffffffffffffff98;
  long *local_60;
  int local_44;
  long local_40;
  long local_38;
  long *local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_10;
  int local_8;
  int local_4;
  
  *in_RDX = 0;
  *in_RCX = 0;
  *in_R8 = 0;
  *in_R9 = 0x7fffffff;
  *in_stack_00000008 = 0;
  local_38 = -1;
  local_40 = -1;
  local_44 = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_EDI;
  do {
    if (local_8 <= local_44) {
      if (*local_18 == 0) {
        local_4 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                     (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90));
      }
      else if (*local_20 == 0) {
        local_4 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                     (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90));
      }
      else {
        if (*local_28 == 0) {
          *local_28 = (long)"output.ssw";
        }
        if (local_38 < 1) {
          local_38 = 0x7fffffff;
        }
        if (local_38 < 0x80000000) {
          *local_30 = local_38;
          if ((local_40 == 0) || (999999 < local_40)) {
            local_4 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                         (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90));
          }
          else {
            if (local_40 < 0) {
              local_40 = 0;
            }
            *in_stack_00000008 = local_40;
            local_4 = 0;
          }
        }
        else {
          local_4 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                       (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                        in_stack_ffffffffffffff90));
        }
      }
      return local_4;
    }
    __s = *(char **)(local_10 + (long)local_44 * 8);
    ppcVar2 = (char **)strlen(__s);
    if (ppcVar2 != (char **)0x0) {
      if (((ppcVar2 < (char **)0x2) || (*__s != '-')) || (__s[1] == '-')) {
        if ((ppcVar2 == (char **)0x6) && (iVar1 = strcmp(__s,"--help"), iVar1 == 0)) {
          mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          return -1;
        }
        if ((ppcVar2 == (char **)0x0) || (*__s == '-')) {
          iVar1 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                     (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90));
          return iVar1;
        }
        if (*local_28 != 0) {
          iVar1 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                     (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                      in_stack_ffffffffffffff90));
          return iVar1;
        }
        if (*local_20 == 0) {
          if (*local_18 == 0) {
            *local_18 = (long)__s;
          }
          else {
            *local_20 = (long)__s;
          }
        }
        else {
          *local_28 = (long)__s;
        }
      }
      else {
        local_60 = (long *)0x0;
        for (in_stack_ffffffffffffff98 = (char **)0x1; in_stack_ffffffffffffff98 < ppcVar2;
            in_stack_ffffffffffffff98 = (char **)((long)in_stack_ffffffffffffff98 + 1)) {
          if (local_60 == (long *)0x0) {
            in_stack_ffffffffffffff94 = (int)__s[(long)in_stack_ffffffffffffff98];
            if (in_stack_ffffffffffffff94 == 0x68) {
              mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                 (char *)CONCAT44(0x68,in_stack_ffffffffffffff90));
              return -1;
            }
            if (in_stack_ffffffffffffff94 == 0x6c) {
              local_60 = &local_38;
            }
            else {
              if (in_stack_ffffffffffffff94 != 0x73) {
                iVar1 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                           (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                            in_stack_ffffffffffffff90));
                return iVar1;
              }
              local_60 = &local_40;
            }
            if ((local_60 != (long *)0x0) &&
               (*local_60 = 0, (char **)((long)in_stack_ffffffffffffff98 + 1U) == ppcVar2)) {
              iVar1 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                         (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90));
              return iVar1;
            }
          }
          else {
            if ((__s[(long)in_stack_ffffffffffffff98] < '0') ||
               ('9' < __s[(long)in_stack_ffffffffffffff98])) {
              iVar1 = mcpl2ssw_app_usage(in_stack_ffffffffffffff98,
                                         (char *)CONCAT44(in_stack_ffffffffffffff94,
                                                          in_stack_ffffffffffffff90));
              return iVar1;
            }
            *local_60 = *local_60 * 10;
            *local_60 = (long)(__s[(long)in_stack_ffffffffffffff98] + -0x30) + *local_60;
          }
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

int mcpl2ssw_parse_args(int argc,const char **argv, const char** inmcplfile,
                        const char **refsswfile, const char **outsswfile,
                        long* nparticles_limit, long* surface_id) {
  //returns: 0 all ok, 1: error, -1: all ok but do nothing (-h/--help mode)
  *inmcplfile = 0;
  *refsswfile = 0;
  *outsswfile = 0;
  *nparticles_limit = INT32_MAX;
  *surface_id = 0;

  int64_t opt_num_limit = -1;
  int64_t opt_num_isurf = -1;
  int i;
  for (i = 1; i<argc; ++i) {
    const char * a = argv[i];
    size_t n = strlen(a);
    if (!n)
      continue;
    if (n>=2&&a[0]=='-'&&a[1]!='-') {
      //short options:
      int64_t * consume_digit = 0;
      size_t j;
      for (j=1; j<n; ++j) {
        if (consume_digit) {
          if (a[j]<'0'||a[j]>'9')
            return mcpl2ssw_app_usage(argv,"Bad option: expected number");
          *consume_digit *= 10;
          *consume_digit += a[j] - '0';
          continue;
        }
        switch(a[j]) {
        case 'h': mcpl2ssw_app_usage(argv,0); return -1;
        case 'l': consume_digit = &opt_num_limit; break;
        case 's': consume_digit = &opt_num_isurf; break;
        default:
          return mcpl2ssw_app_usage(argv,"Unrecognised option");
        }
        if (consume_digit) {
          *consume_digit = 0;
          if (j+1==n)
            return mcpl2ssw_app_usage(argv,"Bad option: missing number");
        }
      }

    } else if (n==6 && strcmp(a,"--help")==0) {
      mcpl2ssw_app_usage(argv,0);
      return -1;
    } else if (n>=1&&a[0]!='-') {
      if (*outsswfile)
        return mcpl2ssw_app_usage(argv,"Too many arguments.");
      if (*refsswfile) *outsswfile = a;
      else if (*inmcplfile) *refsswfile = a;
      else *inmcplfile = a;
    } else {
      return mcpl2ssw_app_usage(argv,"Bad arguments");
    }
  }

  if (!*inmcplfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : input MCPL file");
  if (!*refsswfile)
    return mcpl2ssw_app_usage(argv,"Missing argument : Reference SSW file");
  if (!*outsswfile)
    *outsswfile = "output.ssw";

  if (opt_num_limit<=0)
    opt_num_limit = INT32_MAX;
  if (opt_num_limit>INT32_MAX)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : SSW files can only hold up to 2147483647 particles.");
  *nparticles_limit = (long)opt_num_limit;

  if (opt_num_isurf==0||opt_num_isurf>999999)
    return mcpl2ssw_app_usage(argv,"Parameter out of range : Surface ID must be in range [1,999999].");
  if (opt_num_isurf<0)
    opt_num_isurf = 0;

  *surface_id = (long)opt_num_isurf;

  return 0;
}